

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wbengine.cpp
# Opt level: O2

string * __thiscall
banksia::WbEngine::timeLeftString_abi_cxx11_(string *__return_storage_ptr__,WbEngine *this)

{
  TimeControlMode TVar1;
  Side sd;
  GameTimeController *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  double dVar2;
  double dVar3;
  string s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  this_01 = &s;
  this_00 = (this->super_EngineProfile).super_Engine.super_Player.timeController;
  TVar1 = (this_00->super_TimeController).mode;
  if (TVar1 == standard) {
    sd = (((this->super_EngineProfile).super_Engine.super_Player.board)->super_BoardCore).side;
    dVar2 = GameTimeController::getTimeLeft(this_00,sd);
    dVar3 = GameTimeController::getTimeLeft
                      ((this->super_EngineProfile).super_Engine.super_Player.timeController,1 - sd);
    std::__cxx11::to_string(&local_60,(int)(dVar2 * 100.0));
    std::operator+(&local_80,"time ",&local_60);
    std::operator+(&s,&local_80,"\notim ");
    std::__cxx11::to_string(&local_40,(int)(dVar3 * 100.0));
    std::operator+(__return_storage_ptr__,&s,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&s);
    std::__cxx11::string::~string((string *)&local_80);
    this_01 = &local_60;
  }
  else {
    if (TVar1 != movetime) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&s);
      return __return_storage_ptr__;
    }
    std::__cxx11::to_string(&s,(int)((this_00->super_TimeController).time * 100.0));
    std::operator+(&local_60,"time ",&s);
    std::operator+(&local_80,&local_60,"\notim ");
    std::operator+(__return_storage_ptr__,&local_80,&s);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
  }
  std::__cxx11::string::~string((string *)this_01);
  return __return_storage_ptr__;
}

Assistant:

std::string WbEngine::timeLeftString() const
{
    switch (timeController->mode) {
        case TimeControlMode::movetime:
        {
            auto centiSeconds = static_cast<int>(timeController->time * 100);
            auto s = std::to_string(centiSeconds);
            return "time " + s + "\notim " + s;
        }
            
        case TimeControlMode::standard:
        {
            // timeController unit: second -> centi second
            auto sd = static_cast<int>(board->side);
            auto time = int(timeController->getTimeLeft(sd) * 100);
            auto otime = int(timeController->getTimeLeft(1 - sd) * 100);
            return "time " + std::to_string(time) + "\notim " + std::to_string(otime);
        }
        default:
            break;
    }
    return "";
}